

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

int QFontDatabase::addApplicationFont(QString *fileName)

{
  undefined8 uVar1;
  char *pcVar2;
  qsizetype qVar3;
  char cVar4;
  int iVar5;
  Type *mutex;
  QArrayDataPointer<char> *this;
  QArrayDataPointer<char> *pQVar6;
  long in_FS_OFFSET;
  undefined1 local_78 [24];
  char *pcStack_60;
  qsizetype local_58;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  pQVar6 = (QArrayDataPointer<char> *)local_78;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = (Data *)0x0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  this = &local_48;
  QFileInfo::QFileInfo((QFileInfo *)this,(QString *)fileName);
  cVar4 = QFileInfo::isNativePath();
  QFileInfo::~QFileInfo((QFileInfo *)this);
  if (cVar4 == '\0') {
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)local_78,(QString *)fileName);
    cVar4 = QFile::open(local_78,1);
    if (cVar4 == '\0') {
      QFile::~QFile((QFile *)local_78);
      iVar5 = -1;
      goto LAB_0042a12d;
    }
    QIODevice::readAll();
    qVar3 = local_58;
    pcVar2 = pcStack_60;
    uVar1 = local_78._16_8_;
    local_78._16_8_ = local_48.d;
    pcStack_60 = local_48.ptr;
    local_48.d = (Data *)uVar1;
    local_48.ptr = pcVar2;
    local_58 = local_48.size;
    local_48.size = qVar3;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    QFile::~QFile((QFile *)local_78);
    this = pQVar6;
  }
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                      *)this);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)&local_48,mutex);
  QFontDatabasePrivate::instance();
  iVar5 = QFontDatabasePrivate::addAppFont
                    (&QFontDatabasePrivate::instance::instance,(QByteArray *)(local_78 + 0x10),
                     fileName);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)&local_48);
LAB_0042a12d:
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_78 + 0x10));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QFontDatabase::addApplicationFont(const QString &fileName)
{
    QByteArray data;
    if (!QFileInfo(fileName).isNativePath()) {
        QFile f(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return -1;

        Q_TRACE(QFontDatabase_addApplicationFont, fileName);

        data = f.readAll();
    }
    QMutexLocker locker(fontDatabaseMutex());
    return QFontDatabasePrivate::instance()->addAppFont(data, fileName);
}